

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O0

uint64_t helper_iwmmxt_rorw_arm(CPUARMState *env,uint64_t x,uint32_t n)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint32_t n_local;
  uint64_t x_local;
  CPUARMState *env_local;
  
  bVar3 = (byte)n;
  uVar1 = (x & 0xffff) >> (bVar3 & 0x3f) | (x & 0xffff) << (0x10 - bVar3 & 0x3f);
  uVar2 = uVar1 & 0xffff;
  uVar4 = (x & 0xffff0000) >> (bVar3 & 0x3f) | (x & 0xffff0000) << (0x10 - bVar3 & 0x3f);
  uVar5 = uVar4 & 0xffff0000;
  uVar6 = (x & 0xffff00000000) >> (bVar3 & 0x3f) | (x & 0xffff00000000) << (0x10 - bVar3 & 0x3f);
  uVar7 = uVar6 & 0xffff00000000;
  uVar8 = (x & 0xffff000000000000) >> (bVar3 & 0x3f) |
          (x & 0xffff000000000000) << (0x10 - bVar3 & 0x3f);
  (env->iwmmxt).cregs[3] =
       (uint)((uVar1 & 0x8000) != 0) << 7 | (uint)(uVar2 == 0) << 6 |
       (uint)((uVar4 & 0x80000000) != 0) << 0xf | (uint)(uVar5 == 0) << 0xe |
       (uint)((uVar6 & 0x800000000000) != 0) << 0x17 | (uint)(uVar7 == 0) << 0x16 |
       (uint)((uVar8 & 0x8000000000000000) != 0) << 0x1f | (uint)(uVar8 >> 0x30 == 0) << 0x1e;
  return uVar2 | uVar5 | uVar7 | uVar8 & 0xffff000000000000;
}

Assistant:

uint64_t HELPER(iwmmxt_rorw)(CPUARMState *env, uint64_t x, uint32_t n)
{
    x = ((((x & (0xffffll << 0)) >> n) |
          ((x & (0xffffll << 0)) << (16 - n))) & (0xffffll << 0)) |
        ((((x & (0xffffll << 16)) >> n) |
          ((x & (0xffffll << 16)) << (16 - n))) & (0xffffll << 16)) |
        ((((x & (0xffffll << 32)) >> n) |
          ((x & (0xffffll << 32)) << (16 - n))) & (0xffffll << 32)) |
        ((((x & (0xffffll << 48)) >> n) |
          ((x & (0xffffll << 48)) << (16 - n))) & (0xffffll << 48));
    env->iwmmxt.cregs[ARM_IWMMXT_wCASF] =
        NZBIT16(x >> 0, 0) | NZBIT16(x >> 16, 1) |
        NZBIT16(x >> 32, 2) | NZBIT16(x >> 48, 3);
    return x;
}